

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall
CVmImagePool::vmpbs_load_page
          (CVmImagePool *this,pool_ofs_t ofs,size_t param_3,size_t load_size,char *mem)

{
  CVmImagePool_pg *pCVar1;
  CVmImagePool *in_RCX;
  long in_RDI;
  char *in_R8;
  CVmImagePool_pg *info;
  CVmImagePool *in_stack_ffffffffffffffd0;
  
  pCVar1 = get_page_info_ofs(in_stack_ffffffffffffffd0,(pool_ofs_t)((ulong)in_RDI >> 0x20));
  seek_page_ofs(in_RCX,(pool_ofs_t)((ulong)in_R8 >> 0x20));
  (**(code **)(**(long **)(in_RDI + 0x20) + 0x18))(*(long **)(in_RDI + 0x20),in_R8,in_RCX);
  apply_xor_mask(in_R8,(size_t)in_RCX,pCVar1->xor_mask);
  return;
}

Assistant:

void CVmImagePool::vmpbs_load_page(pool_ofs_t ofs, size_t /*page_size*/,
                                   size_t load_size, char *mem)
{
    CVmImagePool_pg *info;

    /* get the page information */
    info = get_page_info_ofs(ofs);

    /* seek to the correct location in the image file */
    seek_page_ofs(ofs);

    /* ask the underlying file to load the data */
    fp_->copy_data(mem, load_size);

    /* apply the XOR mask to the loaded data */
    apply_xor_mask(mem, load_size, info->xor_mask);
}